

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datatypes.c
# Opt level: O0

Integer pnga_type_c2f(Integer type)

{
  Integer ftype;
  Integer type_local;
  
  switch(type) {
  case 0x3e9:
    ftype = -1;
    break;
  case 0x3ea:
    ftype = 0x3f2;
    break;
  case 0x3eb:
    ftype = 0x3f4;
    break;
  case 0x3ec:
    ftype = 0x3f5;
    break;
  default:
    ftype = type;
    break;
  case 0x3ee:
    ftype = 0x3f6;
    break;
  case 0x3ef:
    ftype = 0x3f7;
    break;
  case 0x3f8:
    ftype = 0x3f2;
  }
  return ftype;
}

Assistant:

Integer pnga_type_c2f(Integer type)
{
Integer ftype;
   switch(type){
   case C_INT: 
                ftype = (sizeof(int) != sizeof(Integer))? -1: MT_F_INT;
                break;
   case C_LONG: 
                ftype = (sizeof(long) != sizeof(Integer))? -1: MT_F_INT;
                break;
   case C_LONGLONG: 
                ftype = (sizeof(long long) != sizeof(Integer))? -1: MT_F_INT;
                break;
   case C_FLOAT:
#       if   SIZEOF_FLOAT == SIZEOF_F77_REAL
                ftype = MT_F_REAL; 
#       elif SIZEOF_FLOAT == SIZEOF_F77_DOUBLE_PRECISION
                ftype = MT_F_DBL; 
#       else
                ftype = -1;
#       endif
                break;
   case C_DBL: 
                ftype = MT_F_DBL;
                break;
   case C_DCPL:
                ftype = MT_F_DCPL;
                break;
   case C_SCPL:
#       if   SIZEOF_FLOAT == SIZEOF_F77_REAL
                ftype = MT_F_SCPL;
#       elif SIZEOF_FLOAT == SIZEOF_F77_DOUBLE_PRECISION
                ftype = MT_F_DCPL;
#       else
                ftype = -1;
#       endif
                break;
   default:     ftype = type;
                break;
   }
   
   return(ftype);
}